

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O1

NodeData * __thiscall IndexTree::search(IndexTree *this,PolarString *key)

{
  Node *__s2;
  Node *pNVar1;
  long *__s1;
  long lVar2;
  long lVar3;
  int iVar4;
  IndexData *pIVar5;
  uint uVar6;
  int32_t iVar7;
  int64_t *fast_this;
  int64_t *fast_that;
  
  pNVar1 = this->nodes;
  __s1 = (long *)key->data_;
  iVar7 = *this->root_node;
  while (iVar7 != -1) {
    __s2 = pNVar1 + iVar7;
    lVar2 = *(long *)pNVar1[iVar7].key;
    lVar3 = *__s1;
    if (lVar3 == lVar2) {
      iVar4 = strcmp((char *)__s1,__s2->key);
      uVar6 = (uint)(iVar4 != 0);
      if (iVar4 < 0) {
        uVar6 = 0xffffffff;
      }
    }
    else {
      uVar6 = ((lVar2 <= lVar3) - 1) + (uint)(lVar2 <= lVar3);
    }
    if (uVar6 == 0) goto LAB_001056b4;
    iVar7 = (&__s2->left)[~uVar6 >> 0x1f];
  }
  iVar7 = -1;
LAB_001056b4:
  pIVar5 = &INDEX_NOT_FOUND;
  if (iVar7 != -1) {
    pIVar5 = &this->nodes[iVar7].data;
  }
  return pIVar5;
}

Assistant:

const IndexTree::NodeData &IndexTree::search(const PolarString &key) {
    auto current = *root_node;
    while (current != -1) {
        auto result = fast_string_cmp(key.data(), nodes[current].key);
        if (result == 0) break;
        current = result < 0 ? nodes[current].left : nodes[current].right;
    }
    if (__glibc_unlikely(current == -1)) return INDEX_NOT_FOUND;
    else return nodes[current].data;
}